

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void bssl::ssl_do_info_callback(SSL *ssl,int type,int value)

{
  pointer psVar1;
  _func_void_SSL_ptr_int_int *local_20;
  _func_void_SSL_ptr_int_int *cb;
  int value_local;
  int type_local;
  SSL *ssl_local;
  
  local_20 = (_func_void_SSL_ptr_int_int *)0x0;
  if (ssl->info_callback == (_func_void_SSL_ptr_int_int *)0x0) {
    psVar1 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl->ctx);
    if (psVar1->info_callback != (_func_void_SSL_ptr_int_int *)0x0) {
      psVar1 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl->ctx);
      local_20 = psVar1->info_callback;
    }
  }
  else {
    local_20 = ssl->info_callback;
  }
  if (local_20 != (_func_void_SSL_ptr_int_int *)0x0) {
    (*local_20)(ssl,type,value);
  }
  return;
}

Assistant:

void ssl_do_info_callback(const SSL *ssl, int type, int value) {
  void (*cb)(const SSL *ssl, int type, int value) = NULL;
  if (ssl->info_callback != NULL) {
    cb = ssl->info_callback;
  } else if (ssl->ctx->info_callback != NULL) {
    cb = ssl->ctx->info_callback;
  }

  if (cb != NULL) {
    cb(ssl, type, value);
  }
}